

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

big_integer *
anon_unknown.dwarf_998c::extract_random_element<big_integer>
          (vector<big_integer,_std::allocator<big_integer>_> *v)

{
  int iVar1;
  __normal_iterator<big_integer_*,_std::vector<big_integer,_std::allocator<big_integer>_>_> *this;
  size_type sVar2;
  vector<big_integer,_std::allocator<big_integer>_> *in_RSI;
  iterator in_RDI;
  size_t index;
  big_integer *copy;
  vector<big_integer,_std::allocator<big_integer>_> *in_stack_ffffffffffffff98;
  big_integer *in_stack_ffffffffffffffb8;
  big_integer *in_stack_ffffffffffffffc0;
  
  iVar1 = rand();
  this = (__normal_iterator<big_integer_*,_std::vector<big_integer,_std::allocator<big_integer>_>_>
          *)(long)iVar1;
  sVar2 = std::vector<big_integer,_std::allocator<big_integer>_>::size(in_RSI);
  std::vector<big_integer,_std::allocator<big_integer>_>::operator[](in_RSI,(ulong)this % sVar2);
  big_integer::big_integer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<big_integer,_std::allocator<big_integer>_>::begin(in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<big_integer_*,_std::vector<big_integer,_std::allocator<big_integer>_>_>::
  operator+(this,(difference_type)in_RDI._M_current);
  erase_unordered<big_integer>(in_stack_ffffffffffffff98,in_RDI);
  return in_RDI._M_current;
}

Assistant:

T extract_random_element(std::vector<T>& v)
    {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }